

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

void sexp_add_path(sexp ctx,char *str)

{
  sexp_proc2 p_Var1;
  sexp ctx_00;
  size_t sVar2;
  sexp psVar3;
  sexp in_RSI;
  sexp in_RDI;
  char *colon;
  sexp in_stack_ffffffffffffffd8;
  sexp in_stack_ffffffffffffffe0;
  
  if ((in_RSI != (sexp)0x0) && ((char)in_RSI->tag != '\0')) {
    ctx_00 = (sexp)strchr((char *)in_RSI,0x3a);
    psVar3 = in_RSI;
    if (ctx_00 == (sexp)0x0) {
      sVar2 = strlen((char *)in_RSI);
      ctx_00 = (sexp)((long)&in_RSI->tag + sVar2);
    }
    else {
      sexp_add_path(in_RSI,(char *)ctx_00);
      in_RSI = in_stack_ffffffffffffffe0;
    }
    sexp_push_op(ctx_00,(sexp_conflict *)in_RSI,in_stack_ffffffffffffffd8);
    psVar3 = sexp_c_string(in_RDI,(char *)psVar3,(sexp_sint_t)ctx_00);
    ((((in_RDI->value).type.setters)->value).context.heap)->max_size = (sexp_uint_t)psVar3;
    p_Var1 = (((in_RDI->value).type.setters)->value).type.finalize;
    p_Var1[5] = (_func_sexp_sexp_sexp_sexp_sint_t_sexp)((byte)p_Var1[5] & 0xfe | 1);
  }
  return;
}

Assistant:

static void sexp_add_path (sexp ctx, const char *str) {
  const char *colon;
  if (str && *str) {
    colon = strchr(str, ':');
    if (colon)
      sexp_add_path(ctx, colon+1);
    else
      colon = str + strlen(str);
    sexp_push(ctx, sexp_global(ctx, SEXP_G_MODULE_PATH), SEXP_VOID);
    sexp_car(sexp_global(ctx, SEXP_G_MODULE_PATH))
      = sexp_c_string(ctx, str, colon-str);
    sexp_immutablep(sexp_global(ctx, SEXP_G_MODULE_PATH)) = 1;
  }
}